

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profiler.hpp
# Opt level: O2

ssize_t __thiscall JEBDebug::Profiler::write(Profiler *this,int __fd,void *__buf,size_t __n)

{
  pointer p_Var1;
  long lVar2;
  long lVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  ostream *poVar6;
  ssize_t sVar7;
  uint uVar8;
  uint uVar9;
  undefined4 in_register_00000034;
  ostream *poVar10;
  _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_> *it;
  pointer p_Var11;
  uint uVar12;
  ulong uVar13;
  anon_class_1_0_00000001 float_width;
  anon_class_1_0_00000001 int_width;
  uint local_68;
  
  poVar10 = (ostream *)CONCAT44(in_register_00000034,__fd);
  p_Var11 = (this->sequence_).
            super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (this->sequence_).
           super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = 8;
  uVar12 = 3;
  uVar8 = 5;
  local_68 = 3;
  uVar13 = 3;
  while( true ) {
    if (p_Var11 == p_Var1) break;
    uVar5 = const::{lambda(auto:1)#1}::operator()
                      ((_lambda_auto_1__1_ *)&int_width,(unsigned_long)p_Var11->_M_node[2]._M_right)
    ;
    if ((int)uVar8 <= (int)uVar5) {
      uVar8 = uVar5;
    }
    uVar5 = const::{lambda(auto:1)#2}::operator()
                      ((_lambda_auto_1__2_ *)&float_width,
                       (double)*(long *)(p_Var11->_M_node + 3) / 1000000000.0);
    if ((int)uVar12 <= (int)uVar5) {
      uVar12 = uVar5;
    }
    uVar5 = const::{lambda(auto:1)#2}::operator()
                      ((_lambda_auto_1__2_ *)&float_width,
                       (double)(long)p_Var11->_M_node[3]._M_parent / 1000000000.0);
    if ((int)local_68 <= (int)uVar5) {
      local_68 = uVar5;
    }
    uVar5 = const::{lambda(auto:1)#2}::operator()
                      ((_lambda_auto_1__2_ *)&float_width,
                       (double)(long)p_Var11->_M_node[3]._M_left / 1000000000.0);
    if ((int)uVar13 <= (int)uVar5) {
      uVar13 = (ulong)uVar5;
    }
    uVar5 = *(uint *)&p_Var11->_M_node[1]._M_left;
    if ((int)uVar9 <= (int)uVar5) {
      uVar9 = uVar5;
    }
    p_Var11 = p_Var11 + 1;
  }
  lVar2 = *(long *)poVar10;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar10 + lVar3 + 0x18) = *(uint *)(poVar10 + lVar3 + 0x18) & 0xffffff4f | 0x80;
  *(ulong *)(poVar10 + *(long *)(lVar2 + -0x18) + 0x10) = (ulong)uVar8;
  poVar6 = std::operator<<(poVar10,"calls");
  poVar6 = std::operator<<(poVar6," ");
  *(ulong *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = (ulong)uVar12;
  poVar6 = std::operator<<(poVar6,"sum");
  poVar6 = std::operator<<(poVar6," ");
  *(ulong *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = (ulong)local_68;
  poVar6 = std::operator<<(poVar6,"min");
  poVar6 = std::operator<<(poVar6," ");
  *(ulong *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = uVar13;
  poVar6 = std::operator<<(poVar6,"max");
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  poVar6 = std::operator<<(poVar6,"  ");
  *(ulong *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = (ulong)uVar9;
  poVar6 = std::operator<<(poVar6,"function");
  std::operator<<(poVar6,"  file\n");
  lVar2 = *(long *)poVar10;
  *(undefined8 *)(poVar10 + *(long *)(lVar2 + -0x18) + 8) = 4;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar10 + lVar2 + 0x18) = *(uint *)(poVar10 + lVar2 + 0x18) & 0xfffffefb | 4;
  p_Var1 = (this->sequence_).
           super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var11 = (this->sequence_).
                 super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; p_Var11 != p_Var1; p_Var11 = p_Var11 + 1
      ) {
    p_Var4 = p_Var11->_M_node;
    lVar2 = *(long *)poVar10;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar10 + lVar3 + 0x18) = *(uint *)(poVar10 + lVar3 + 0x18) & 0xffffff4f | 0x80;
    *(ulong *)(poVar10 + *(long *)(lVar2 + -0x18) + 0x10) = (ulong)uVar8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar6 = std::operator<<(poVar6," ");
    *(ulong *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = (ulong)uVar12;
    poVar6 = std::ostream::_M_insert<double>((double)*(long *)(p_Var4 + 3) / 1000000000.0);
    poVar6 = std::operator<<(poVar6," ");
    *(ulong *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = (ulong)local_68;
    poVar6 = std::ostream::_M_insert<double>((double)(long)p_Var4[3]._M_parent / 1000000000.0);
    poVar6 = std::operator<<(poVar6," ");
    *(ulong *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = uVar13;
    poVar6 = std::ostream::_M_insert<double>((double)(long)p_Var4[3]._M_left / 1000000000.0);
    poVar6 = std::operator<<(poVar6,"  ");
    lVar2 = *(long *)poVar6;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffff4f | 0x20;
    *(ulong *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = (ulong)uVar9;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)p_Var4[1]._M_right,(long)p_Var4[1]._M_left);
    poVar6 = std::operator<<(poVar6,"  ");
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)p_Var4[1]._M_parent,*(long *)(p_Var4 + 1));
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,'\n');
  }
  sVar7 = std::ostream::flush();
  return sVar7;
}

Assistant:

void write(std::ostream& os) const
        {
            auto int_width = [](auto n)
            {
                if (n == 0)
                    return 1;
                if (n < 0)
                    return int(std::ceil(std::log10(-n)) + 1);
                return int(std::ceil(std::log10(n)));
            };

            auto float_width = [](auto n)
            {
                if (n < 0)
                    return int(std::ceil(std::log10(-n)) + 6);
                if (n < 1)
                    return 6;
                return int(std::ceil(std::log10(n))) + 5;
            };

            int widths[5] = {5, 3, 3, 3, 8};
            for (const auto& it : sequence_)
            {
                widths[0] = std::max(widths[0], int_width(it->second.count()));
                widths[1] = std::max(widths[1], float_width(it->second.acc_time()));
                widths[2] = std::max(widths[2], float_width(it->second.min_time()));
                widths[3] = std::max(widths[3], float_width(it->second.max_time()));
                widths[4] = std::max(widths[4], int(it->first.func_name.size()));
            }
            using std::left, std::right, std::setw;
            os << right << setw(widths[0]) << "calls"
               << " " << setw(widths[1]) << "sum"
               << " " << setw(widths[2]) << "min"
               << " " << setw(widths[3]) << "max"
               << left << "  " << setw(widths[4]) << "function"
               << "  file\n";

            os << std::setprecision(4) << std::fixed;
            for (auto it : sequence_)
            {
                os << right << setw(widths[0]) << it->second.count()
                   << " " << setw(widths[1]) << it->second.acc_time()
                   << " " << setw(widths[2]) << it->second.min_time()
                   << " " << setw(widths[3]) << it->second.max_time()
                   << "  " << left << setw(widths[4]) << it->first.func_name
                   << "  " << it->first.file_name
                   #ifdef _MSC_VER
                   << "(" << it->first.line_no << ")"
                   #else
                   << ":" << it->first.line_no
                   #endif
                   << '\n';
            }
            os.flush();
        }